

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::WriteInt16(ON_BinaryArchive *this,size_t count,ON__INT16 *p)

{
  bool bVar1;
  bool bVar2;
  
  if (this->m_endian != big_endian) {
    bVar1 = WriteByte(this,count * 2,p);
    return bVar1;
  }
  bVar1 = true;
  if (count != 0) {
    while ((bVar1 != false && (bVar2 = count != 0, count = count - 1, bVar2))) {
      bVar1 = WriteByte(this,1,(void *)((long)p + 1));
      if (bVar1) {
        bVar1 = WriteByte(this,1,p);
      }
      else {
        bVar1 = false;
      }
      p = p + 1;
    }
  }
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::WriteInt16(   // Write an array of 16 bit shorts
		size_t count,               // number of shorts to write
		const ON__INT16* p
		)
{
  bool rc = true;
  if (m_endian == ON::endian::big_endian)
  {
    if ( count > 0 ) 
    {
      const char* b = (const char*)p;
      while ( rc && count-- ) 
      {
        rc = WriteByte( 1, b+1 );
        if (rc)
          rc = WriteByte( 1, b );
        b++;
        b++;
      }
    }
  }
  else 
  {
    rc = WriteByte( count<<1, p );
  }
  return rc;
}